

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mulut.h
# Opt level: O0

void __thiscall MulutTertawa::MulutTertawa(MulutTertawa *this)

{
  Point<double> local_a0;
  Point<double> local_88;
  Point<double> local_70;
  Point<double> local_48;
  curve local_30 [32];
  MulutTertawa *local_10;
  MulutTertawa *this_local;
  
  local_10 = this;
  Polygon::Polygon(&this->super_Polygon);
  Point<double>::Point(&local_48,210.0,500.0,0.0);
  Point<double>::Point(&local_70,240.0,520.0,0.0);
  Point<double>::Point(&local_88,300.0,520.0,0.0);
  Point<double>::Point(&local_a0,330.0,500.0,0.0);
  curve::curve(local_30,&local_48,&local_70,&local_88,&local_a0,(undefined4)Color::WHITE);
  Polygon::addCurve(this,local_30);
  curve::~curve(local_30);
  Polygon::setColor((int)this,0xa0,0x52,0x2d);
  return;
}

Assistant:

MulutTertawa() {
    //baw
    addCurve(curve(Point<double>(210, 500), Point<double>(240, 520), Point<double>(300, 520), Point<double>(330, 500)));
    //addCurve(curve(Point<double>(330, 500), Point<double>(300, 515), Point<double>(240, 515), Point<double>(210, 500)));
    setColor(160,82,45,0);
  }